

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall
DependencyScan::RecomputeDirty
          (DependencyScan *this,Node *initial_node,
          vector<Node_*,_std::allocator<Node_*>_> *validation_nodes,string *err)

{
  pointer *this_00;
  _Map_pointer *ppppNVar1;
  bool bVar2;
  reference ppNVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_158;
  const_iterator local_150;
  iterator local_148;
  Node **local_128;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_120;
  iterator local_118;
  const_iterator local_f8;
  undefined4 local_d4;
  value_type local_d0;
  Node *node;
  allocator<Node_*> local_b1;
  undefined1 local_b0 [8];
  deque<Node_*,_std::allocator<Node_*>_> nodes;
  vector<Node_*,_std::allocator<Node_*>_> new_validation_nodes;
  vector<Node_*,_std::allocator<Node_*>_> stack;
  string *err_local;
  vector<Node_*,_std::allocator<Node_*>_> *validation_nodes_local;
  Node *initial_node_local;
  DependencyScan *this_local;
  
  validation_nodes_local = (vector<Node_*,_std::allocator<Node_*>_> *)initial_node;
  initial_node_local = (Node *)this;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)
             &new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)
             &nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  std::allocator<Node_*>::allocator(&local_b1);
  std::deque<Node_*,_std::allocator<Node_*>_>::deque
            ((deque<Node_*,_std::allocator<Node_*>_> *)local_b0,1,
             (value_type *)&validation_nodes_local,&local_b1);
  std::allocator<Node_*>::~allocator(&local_b1);
  do {
    bVar2 = std::deque<Node_*,_std::allocator<Node_*>_>::empty
                      ((deque<Node_*,_std::allocator<Node_*>_> *)local_b0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = 1;
LAB_0013024c:
      local_d4 = 1;
      std::deque<Node_*,_std::allocator<Node_*>_>::~deque
                ((deque<Node_*,_std::allocator<Node_*>_> *)local_b0);
      std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)
                 &nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
      std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)
                 &new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return (bool)(this_local._7_1_ & 1);
    }
    ppNVar3 = std::deque<Node_*,_std::allocator<Node_*>_>::front
                        ((deque<Node_*,_std::allocator<Node_*>_> *)local_b0);
    local_d0 = *ppNVar3;
    std::deque<Node_*,_std::allocator<Node_*>_>::pop_front
              ((deque<Node_*,_std::allocator<Node_*>_> *)local_b0);
    this_00 = &new_validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<Node_*,_std::allocator<Node_*>_>::clear
              ((vector<Node_*,_std::allocator<Node_*>_> *)this_00);
    ppppNVar1 = &nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node;
    std::vector<Node_*,_std::allocator<Node_*>_>::clear
              ((vector<Node_*,_std::allocator<Node_*>_> *)ppppNVar1);
    bVar2 = RecomputeNodeDirty(this,local_d0,(vector<Node_*,_std::allocator<Node_*>_> *)this_00,
                               (vector<Node_*,_std::allocator<Node_*>_> *)ppppNVar1,err);
    if (!bVar2) {
      this_local._7_1_ = 0;
      goto LAB_0013024c;
    }
    std::deque<Node_*,_std::allocator<Node_*>_>::end
              (&local_118,(deque<Node_*,_std::allocator<Node_*>_> *)local_b0);
    std::_Deque_iterator<Node*,Node*const&,Node*const*>::
    _Deque_iterator<std::_Deque_iterator<Node*,Node*&,Node**>,void>
              ((_Deque_iterator<Node*,Node*const&,Node*const*> *)&local_f8,&local_118);
    ppppNVar1 = &nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node;
    local_120._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                            ((vector<Node_*,_std::allocator<Node_*>_> *)ppppNVar1);
    local_128 = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                   ((vector<Node_*,_std::allocator<Node_*>_> *)ppppNVar1);
    std::deque<Node*,std::allocator<Node*>>::
    insert<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,void>
              (&local_148,(deque<Node*,std::allocator<Node*>> *)local_b0,&local_f8,local_120,
               (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)local_128)
    ;
    bVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::empty
                      ((vector<Node_*,_std::allocator<Node_*>_> *)
                       &nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node);
    if (!bVar2) {
      if (validation_nodes == (vector<Node_*,_std::allocator<Node_*>_> *)0x0) {
        __assert_fail("validation_nodes && \"validations require RecomputeDirty to be called with validation_nodes\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph.cc"
                      ,0x49,
                      "bool DependencyScan::RecomputeDirty(Node *, std::vector<Node *> *, string *)"
                     );
      }
      local_158._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(validation_nodes);
      __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
      __normal_iterator<Node**>
                ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                 &local_150,&local_158);
      ppppNVar1 = &nodes.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node;
      __first = std::vector<Node_*,_std::allocator<Node_*>_>::begin
                          ((vector<Node_*,_std::allocator<Node_*>_> *)ppppNVar1);
      __last = std::vector<Node_*,_std::allocator<Node_*>_>::end
                         ((vector<Node_*,_std::allocator<Node_*>_> *)ppppNVar1);
      std::vector<Node*,std::allocator<Node*>>::
      insert<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,void>
                ((vector<Node*,std::allocator<Node*>> *)validation_nodes,local_150,
                 (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
                 __first._M_current,
                 (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>)
                 __last._M_current);
    }
  } while( true );
}

Assistant:

bool DependencyScan::RecomputeDirty(Node* initial_node,
                                    std::vector<Node*>* validation_nodes,
                                    string* err) {
  std::vector<Node*> stack;
  std::vector<Node*> new_validation_nodes;

  std::deque<Node*> nodes(1, initial_node);

  // RecomputeNodeDirty might return new validation nodes that need to be
  // checked for dirty state, keep a queue of nodes to visit.
  while (!nodes.empty()) {
    Node* node = nodes.front();
    nodes.pop_front();

    stack.clear();
    new_validation_nodes.clear();

    if (!RecomputeNodeDirty(node, &stack, &new_validation_nodes, err))
      return false;
    nodes.insert(nodes.end(), new_validation_nodes.begin(),
                              new_validation_nodes.end());
    if (!new_validation_nodes.empty()) {
      assert(validation_nodes &&
          "validations require RecomputeDirty to be called with validation_nodes");
      validation_nodes->insert(validation_nodes->end(),
                           new_validation_nodes.begin(),
                           new_validation_nodes.end());
    }
  }

  return true;
}